

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

bool __thiscall olc::ResourcePack::SavePack(ResourcePack *this,string *sFile,string *sKey)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  void *pvVar3;
  char cVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  ResourcePack *this_00;
  int iVar7;
  long lVar8;
  uint32_t nIndexStringLen;
  vector<char,_std::allocator<char>_> sIndexString;
  uint32_t nMapSize;
  uint32_t nIndexSize;
  vector<char,_std::allocator<char>_> stream;
  ofstream ofs;
  int local_46c;
  vector<char,_std::allocator<char>_> local_468;
  _Rb_tree_color local_450;
  int local_44c;
  ResourcePack *local_448;
  string *local_440;
  vector<char,_std::allocator<char>_> local_438 [21];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)sFile,_S_bin);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    local_44c = 0;
    std::ostream::write((char *)&local_230,(long)&local_44c);
    local_450 = (_Rb_tree_color)(this->mapFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::ostream::write((char *)&local_230,(long)&local_450);
    p_Var5 = (this->mapFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->mapFiles)._M_t._M_impl.super__Rb_tree_header;
    local_448 = this;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      do {
        local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)p_Var5[1]._M_parent;
        std::ostream::write((char *)&local_230,(long)local_438);
        std::ostream::write((char *)&local_230,*(long *)(p_Var5 + 1));
        std::ostream::write((char *)&local_230,(long)(p_Var5 + 2));
        std::ostream::write((char *)&local_230,(long)&p_Var5[2].field_0x4);
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
    local_440 = sKey;
    local_44c = std::ostream::tellp();
    p_Var6 = (local_448->mapFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      iVar7 = local_44c;
      do {
        *(int *)&p_Var6[2].field_0x4 = iVar7;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_468,
                   (ulong)p_Var6[2]._M_color,(allocator_type *)local_438);
        std::ifstream::ifstream((allocator_type *)local_438,(string *)(p_Var6 + 1),_S_bin);
        std::istream::read((char *)local_438,
                           CONCAT44(local_468.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)local_468.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start));
        std::ifstream::close();
        std::ostream::write((char *)&local_230,
                            CONCAT44(local_468.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)local_468.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_start));
        _Var2 = p_Var6[2]._M_color;
        std::ifstream::~ifstream((allocator_type *)local_438);
        pvVar3 = (void *)CONCAT44(local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)local_468.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,(long)local_468.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar3);
        }
        iVar7 = iVar7 + _Var2;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    this_00 = (ResourcePack *)0x4;
    std::vector<char,_std::allocator<char>_>::resize(local_438,4);
    *(_Rb_tree_color *)
     local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
     _M_start = local_450;
    p_Var5 = (local_448->mapFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      do {
        p_Var6 = p_Var5[1]._M_parent;
        lVar8 = (long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        std::vector<char,_std::allocator<char>_>::resize(local_438,lVar8 + 4);
        *(int *)((long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar8) = (int)p_Var6;
        pvVar3 = *(void **)(p_Var5 + 1);
        lVar8 = (long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        std::vector<char,_std::allocator<char>_>::resize(local_438,(long)p_Var6 + lVar8);
        memcpy((void *)(lVar8 + (long)local_438[0].super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start),pvVar3,
               (size_t)p_Var6);
        lVar8 = (long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        std::vector<char,_std::allocator<char>_>::resize(local_438,lVar8 + 4);
        *(_Rb_tree_color *)
         ((long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start + lVar8) = p_Var5[2]._M_color;
        lVar8 = (long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        this_00 = (ResourcePack *)(lVar8 + 4);
        std::vector<char,_std::allocator<char>_>::resize(local_438,(size_type)this_00);
        *(undefined4 *)
         ((long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start + lVar8) = *(undefined4 *)&p_Var5[2].field_0x4;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
    scramble(&local_468,this_00,local_438,local_440);
    local_46c = (int)local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
                (int)local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    std::ostream::seekp((long)&local_230,_S_beg);
    std::ostream::write((char *)&local_230,(long)&local_46c);
    std::ostream::write((char *)&local_230,
                        CONCAT44(local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 (int)local_468.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start));
    std::ofstream::close();
    pvVar3 = (void *)CONCAT44(local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (int)local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                   .super__Vector_impl_data._M_start);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
    }
    if ((_Base_ptr)
        local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start != (_Base_ptr)0x0) {
      operator_delete(local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_438[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __M_split_cmpts;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return (bool)cVar4;
}

Assistant:

bool ResourcePack::SavePack(const std::string& sFile, const std::string& sKey)
	{
		// Create/Overwrite the resource file
		std::ofstream ofs(sFile, std::ofstream::binary);
		if (!ofs.is_open()) return false;

		// Iterate through map
		uint32_t nIndexSize = 0; // Unknown for now
		ofs.write((char*)&nIndexSize, sizeof(uint32_t));
		uint32_t nMapSize = uint32_t(mapFiles.size());
		ofs.write((char*)&nMapSize, sizeof(uint32_t));
		for (auto& e : mapFiles)
		{
			// Write the path of the file
			size_t nPathSize = e.first.size();
			ofs.write((char*)&nPathSize, sizeof(uint32_t));
			ofs.write(e.first.c_str(), nPathSize);

			// Write the file entry properties
			ofs.write((char*)&e.second.nSize, sizeof(uint32_t));
			ofs.write((char*)&e.second.nOffset, sizeof(uint32_t));
		}

		// 2) Write the individual Data
		std::streampos offset = ofs.tellp();
		nIndexSize = (uint32_t)offset;
		for (auto& e : mapFiles)
		{
			// Store beginning of file offset within resource pack file
			e.second.nOffset = (uint32_t)offset;

			// Load the file to be added
			std::vector<uint8_t> vBuffer(e.second.nSize);
			std::ifstream i(e.first, std::ifstream::binary);
			i.read((char*)vBuffer.data(), e.second.nSize);
			i.close();

			// Write the loaded file into resource pack file
			ofs.write((char*)vBuffer.data(), e.second.nSize);
			offset += e.second.nSize;
		}

		// 3) Scramble Index
		std::vector<char> stream;
		auto write = [&stream](const char* data, size_t size) {
			size_t sizeNow = stream.size();
			stream.resize(sizeNow + size);
			memcpy(stream.data() + sizeNow, data, size);
		};

		// Iterate through map
		write((char*)&nMapSize, sizeof(uint32_t));
		for (auto& e : mapFiles)
		{
			// Write the path of the file
			size_t nPathSize = e.first.size();
			write((char*)&nPathSize, sizeof(uint32_t));
			write(e.first.c_str(), nPathSize);

			// Write the file entry properties
			write((char*)&e.second.nSize, sizeof(uint32_t));
			write((char*)&e.second.nOffset, sizeof(uint32_t));
		}
		std::vector<char> sIndexString = scramble(stream, sKey);
		uint32_t nIndexStringLen = uint32_t(sIndexString.size());
		// 4) Rewrite Map (it has been updated with offsets now)
		// at start of file
		ofs.seekp(0, std::ios::beg);
		ofs.write((char*)&nIndexStringLen, sizeof(uint32_t));
		ofs.write(sIndexString.data(), nIndexStringLen);
		ofs.close();
		return true;
	}